

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

OPAtomIndexFooter * __thiscall
ASDCP::MXF::OPAtomIndexFooter::WriteToFile
          (OPAtomIndexFooter *this,FileWriter *Writer,ui64_t duration)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  MDDEntry *pMVar4;
  undefined8 in_RCX;
  long *plVar5;
  FrameBuffer FooterBuffer;
  FrameBuffer WriteWrapper;
  undefined1 local_168 [104];
  Result_t result;
  FrameBuffer local_98 [2];
  
  if (*(long *)(Writer + 0x78) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x49e,
                  "virtual ASDCP::Result_t ASDCP::MXF::OPAtomIndexFooter::WriteToFile(Kumu::FileWriter &, ui64_t)"
                 );
  }
  FrameBuffer::FrameBuffer(&FooterBuffer);
  FrameBuffer::Capacity((FrameBuffer *)&result,(ui32_t)&FooterBuffer);
  lVar3 = *(long *)(Writer + 0x140);
  if (lVar3 != 0) {
    *(long *)(lVar3 + 200) = (*(long *)(lVar3 + 0x110) - *(long *)(lVar3 + 0x108)) / 0x18;
    *(undefined8 *)(Writer + 0x140) = 0;
  }
  plVar2 = *(long **)(Writer + 0x70);
  iVar1 = 0;
  plVar5 = plVar2;
  do {
    plVar5 = (long *)*plVar5;
    if (plVar5 == plVar2) {
      if (-1 < (int)_result) {
        *(ulong *)(Writer + 0xa8) = (ulong)FooterBuffer.m_Size;
        pMVar4 = Dictionary::Type(*(Dictionary **)(Writer + 0x78),MDD_CompleteFooter);
        WriteWrapper.m_Data._0_1_ = 1;
        WriteWrapper._9_8_ = *(undefined8 *)pMVar4->ul;
        WriteWrapper._17_7_ = SUB87(*(undefined8 *)(pMVar4->ul + 8),0);
        WriteWrapper.m_Size._0_1_ = (undefined1)((ulong)*(undefined8 *)(pMVar4->ul + 8) >> 0x38);
        WriteWrapper._vptr_FrameBuffer = (_func_int **)&PTR__IArchive_002112c8;
        Partition::WriteToFile((Partition *)local_168,Writer,(UL *)duration);
        Kumu::Result_t::operator=(&result,(Result_t *)local_168);
        Kumu::Result_t::~Result_t((Result_t *)local_168);
        if (-1 < (int)_result) {
          WriteWrapper._vptr_FrameBuffer =
               (_func_int **)((ulong)WriteWrapper._vptr_FrameBuffer & 0xffffffff00000000);
          Kumu::FileWriter::Write(local_168,(uint)duration,(uint *)FooterBuffer.m_Data);
          Kumu::Result_t::operator=(&result,(Result_t *)local_168);
          Kumu::Result_t::~Result_t((Result_t *)local_168);
          if ((ui32_t)WriteWrapper._vptr_FrameBuffer != FooterBuffer.m_Size) {
            __assert_fail("write_count == FooterBuffer.Size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                          ,0x4d0,
                          "virtual ASDCP::Result_t ASDCP::MXF::OPAtomIndexFooter::WriteToFile(Kumu::FileWriter &, ui64_t)"
                         );
          }
        }
      }
LAB_00199bc5:
      Kumu::Result_t::Result_t((Result_t *)this,&result);
LAB_00199bda:
      Kumu::Result_t::~Result_t(&result);
      FrameBuffer::~FrameBuffer(&FooterBuffer);
      return this;
    }
    if ((int)_result < 0) goto LAB_00199bc5;
    plVar2 = (long *)plVar5[2];
    if ((plVar2 != (long *)0x0) &&
       (lVar3 = __dynamic_cast(plVar2,&InterchangeObject::typeinfo,&IndexTableSegment::typeinfo,0),
       lVar3 != 0)) {
      if (*(int *)(Writer + 0x148) == 0) {
        iVar1 = iVar1 + 1;
      }
      else {
        if (iVar1 != 0) {
          Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
          goto LAB_00199bda;
        }
        *(undefined8 *)(lVar3 + 200) = in_RCX;
        iVar1 = 1;
      }
    }
    plVar2[10] = *(long *)(Writer + 0x180);
    FrameBuffer::FrameBuffer(&WriteWrapper);
    FrameBuffer::SetData
              (local_98,(byte_t *)&WriteWrapper,FooterBuffer.m_Size + (int)FooterBuffer.m_Data);
    Kumu::Result_t::~Result_t((Result_t *)local_98);
    (**(code **)(*plVar2 + 0x70))((Result_t *)local_168,plVar2,&WriteWrapper);
    Kumu::Result_t::operator=(&result,(Result_t *)local_168);
    Kumu::Result_t::~Result_t((Result_t *)local_168);
    FooterBuffer.m_Size = FooterBuffer.m_Size + WriteWrapper.m_Size;
    FrameBuffer::~FrameBuffer(&WriteWrapper);
    plVar2 = *(long **)(Writer + 0x70);
  } while( true );
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OPAtomIndexFooter::WriteToFile(Kumu::FileWriter& Writer, ui64_t duration)
{
  assert(m_Dict);
  ASDCP::FrameBuffer FooterBuffer;
  ui32_t   footer_size = m_PacketList->m_List.size() * MaxIndexSegmentSize; // segment-count * max-segment-size
  Result_t result = FooterBuffer.Capacity(footer_size); 
  ui32_t   iseg_count = 0;

  if ( m_CurrentSegment != 0 )
    {
      m_CurrentSegment->IndexDuration = m_CurrentSegment->IndexEntryArray.size();
      m_CurrentSegment = 0;
    }

  std::list<InterchangeObject*>::iterator pl_i = m_PacketList->m_List.begin();
  for ( ; pl_i != m_PacketList->m_List.end() && ASDCP_SUCCESS(result); pl_i++ )
    {
      IndexTableSegment *segment = dynamic_cast<IndexTableSegment*>(*pl_i);

      if ( segment != 0 )
	{
	  iseg_count++;
	  if ( m_BytesPerEditUnit != 0 )
	    {
	      if ( iseg_count != 1 )
		return RESULT_STATE;

	      segment->IndexDuration = duration;
	    }
	}

      InterchangeObject* object = *pl_i;
      object->m_Lookup = m_Lookup;

      ASDCP::FrameBuffer WriteWrapper;
      WriteWrapper.SetData(FooterBuffer.Data() + FooterBuffer.Size(),
			   FooterBuffer.Capacity() - FooterBuffer.Size());
      result = object->WriteToBuffer(WriteWrapper);
      FooterBuffer.Size(FooterBuffer.Size() + WriteWrapper.Size());
    }

  if ( ASDCP_SUCCESS(result) )
    {
      IndexByteCount = FooterBuffer.Size();
      UL FooterUL(m_Dict->ul(MDD_CompleteFooter));
      result = Partition::WriteToFile(Writer, FooterUL);
    }

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t write_count = 0;
      result = Writer.Write(FooterBuffer.RoData(), FooterBuffer.Size(), &write_count);
      assert(write_count == FooterBuffer.Size());
    }

  return result;
}